

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O2

bool __thiscall IR::PropertySymOpnd::NeedsLoadFromProtoTypeCheck(PropertySymOpnd *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = MayNeedTypeCheckProtection(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.h"
                       ,0x472,"(MayNeedTypeCheckProtection())","MayNeedTypeCheckProtection()");
    if (!bVar2) goto LAB_003d9c56;
    *puVar3 = 0;
  }
  bVar2 = TypeCheckSeqBitsSetOnlyIfCandidate(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.h"
                       ,0x473,"(TypeCheckSeqBitsSetOnlyIfCandidate())",
                       "TypeCheckSeqBitsSetOnlyIfCandidate()");
    if (!bVar2) {
LAB_003d9c56:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (((ushort)this->field_12 & 1) == 0) {
    bVar2 = NeedsPrimaryTypeCheck(this);
    if (!bVar2) {
      bVar2 = IsLoadedFromProto(this);
      if (bVar2) {
        bVar2 = NeedsWriteGuardTypeCheck(this);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool NeedsLoadFromProtoTypeCheck() const
    {
        Assert(MayNeedTypeCheckProtection());
        Assert(TypeCheckSeqBitsSetOnlyIfCandidate());
        // Proto cache, where type has been checked but property might have been written to since then.
        return !IsTypeCheckOnly() && !NeedsPrimaryTypeCheck() && IsLoadedFromProto() && NeedsWriteGuardTypeCheck();
    }